

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O1

void __thiscall
Kvm::addEnvProc(Kvm *this,Value *env,char *schemeName,_func_Value_ptr_Kvm_ptr_Value_ptr *proc)

{
  Kgc *this_00;
  pointer *ppppVVar1;
  Value *result2;
  Value *result1;
  allocator<char> local_61;
  Value *local_60;
  Value *local_58;
  string local_50;
  
  local_58 = (Value *)0x0;
  local_60 = (Value *)0x0;
  this_00 = &this->gc_;
  Kgc::pushLocalStackRoot(this_00,&local_58);
  Kgc::pushLocalStackRoot(this_00,&local_60);
  local_60 = Kgc::allocValue(this_00,PRIM_PROC);
  local_60[1]._vptr_Value = (_func_int **)proc;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,schemeName,&local_61);
  local_58 = makeSymbol(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  defineVariable(this,local_58,local_60,env);
  ppppVVar1 = &(this->gc_).localStackRoots_.
               super__Vector_base<const_Value_**,_std::allocator<const_Value_**>_>._M_impl.
               super__Vector_impl_data._M_finish;
  *ppppVVar1 = *ppppVVar1 + -2;
  return;
}

Assistant:

void Kvm::addEnvProc(Value *env, const char *schemeName, const Value * (*proc)(Kvm *vm, const Value *))
{
    const Value *result1 = nullptr;
    const Value *result2 = nullptr;
    GcGuard guard{gc_};
    guard.pushLocalStackRoot(&result1);
    guard.pushLocalStackRoot(&result2);
    result2 = makeProc(proc);
    result1 = makeSymbol(schemeName);
    defineVariable(result1, result2, env);
}